

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

wchar_t price_item(store *store,object *obj,_Bool store_buying,wchar_t qty)

{
  owner *poVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint uVar6;
  player_race_list *ppVar7;
  
  if (store == (store *)0x0) {
    return L'\0';
  }
  poVar1 = store->owner;
  _Var2 = tval_can_have_charges(obj);
  if (_Var2) {
    wVar3 = object_value_real(obj,qty);
    wVar4 = object_value(obj,qty);
    wVar5 = qty;
    if (store_buying) {
      if (wVar4 < wVar3) goto LAB_001c2119;
    }
    else if (wVar3 < wVar4) goto LAB_001c2119;
LAB_001c2137:
    wVar5 = object_value_real(obj,wVar5);
  }
  else {
    wVar5 = object_value_real(obj,L'\x01');
    wVar3 = object_value(obj,L'\x01');
    if (store_buying) {
      if (wVar5 <= wVar3) {
LAB_001c2131:
        wVar5 = L'\x01';
        goto LAB_001c2137;
      }
    }
    else if (wVar3 <= wVar5) goto LAB_001c2131;
    wVar5 = L'\x01';
LAB_001c2119:
    wVar5 = object_value(obj,wVar5);
  }
  if (wVar5 < L'\x01') {
    if (store_buying) {
      qty = L'\0';
    }
  }
  else {
    ppVar7 = (player_race_list *)&poVar1->race->dislikes;
    do {
      ppVar7 = ppVar7->next;
      if (ppVar7 == (player_race_list *)0x0) break;
    } while (ppVar7->race != player->race);
    wVar3 = ppVar7->rel;
    if (store->sidx == store_black_market_idx) {
      wVar3 = (wVar3 * 3) / 2;
    }
    if (store_buying) {
      wVar4 = L'È' - wVar3;
      wVar3 = L'd';
      if (wVar4 < L'd') {
        wVar3 = wVar4;
      }
      uVar6 = (uint)(wVar5 << (store->sidx != store_black_market_idx)) / 3;
      if ((player->opts).opt[0x25] != false) {
        return L'\0';
      }
    }
    else {
      _Var2 = tval_can_have_charges(obj);
      wVar5 = L'\x01';
      if (_Var2) {
        wVar5 = qty;
      }
      wVar5 = object_value_real(obj,wVar5);
      uVar6 = wVar5 << (store->sidx == store_black_market_idx);
    }
    _Var2 = tval_can_have_charges(obj);
    wVar5 = L'\x01';
    if (!_Var2) {
      wVar5 = qty;
    }
    wVar5 = wVar5 * (int)(((long)(wVar3 * uVar6) + 0x32) / 100);
    if ((store_buying) && (wVar3 = poVar1->max_cost * qty, wVar3 <= wVar5)) {
      wVar5 = wVar3;
    }
    if (L'\0' < wVar5) {
      qty = wVar5;
    }
  }
  return qty;
}

Assistant:

int price_item(struct store *store, const struct object *obj,
			   bool store_buying, int qty)
{
	int adjust = 100;
	int price;
	struct owner *proprietor;
	struct player_race_list *dislikes;

	if (!store) {
		return 0;
	}

	proprietor = store->owner;

	/* Get the value of the stack of wands, or a single item */
	if (tval_can_have_charges(obj)) {
		if (store_buying) {
			price = MIN(object_value_real(obj, qty),
				object_value(obj, qty));
		} else {
			price = MAX(object_value_real(obj, qty),
				object_value(obj, qty));
		}
	} else {
		if (store_buying) {
			price = MIN(object_value_real(obj, 1),
				object_value(obj, 1));
		} else {
			price = MAX(object_value_real(obj, 1),
				object_value(obj, 1));
		}
	}

	/* Worthless items */
	if (price <= 0) {
		return (store_buying) ? 0 : qty;
	}

	/* Compute the racial factor */
	dislikes = proprietor->race->dislikes;
	while (dislikes) {
		if (dislikes->race == player->race) break;
		dislikes = dislikes->next;
	}
	adjust = dislikes->rel;

	/* The black market is always a worse deal */
	if (store_is_black_market(store)) {
		adjust = (adjust * 3) / 2;
	}

	/* Shop is buying */
	if (store_buying) {
		/* Set the factor */
		adjust = 100 + (100 - adjust);
		if (adjust > 100) {
			adjust = 100;
		}

		/* Shops now pay 2/3 of true value */
		price = price * 2 / 3;

		/* Black market sucks */
		if (store_is_black_market(store)) {
			price = price / 2;
		}

		/* Check for no_selling option */
		if (OPT(player, birth_no_selling)) {
			return 0;
		}
	} else {
		/* Re-evaluate if we're selling */
		if (tval_can_have_charges(obj)) {
			price = object_value_real(obj, qty);
		} else {
			price = object_value_real(obj, 1);
		}

		/* Black market sucks */
		if (store_is_black_market(store)) {
			price = price * 2;
		}
	}

	/* Compute the final price (with rounding) */
	price = (price * adjust + 50L) / 100L;

	/* Now convert price to total price for non-wands */
	if (!tval_can_have_charges(obj)) {
		price *= qty;
	}

	/* Now limit the price to the purse limit */
	if (store_buying && (price > proprietor->max_cost * qty)) {
		price = proprietor->max_cost * qty;
	}

	/* Note -- Never become "free" */
	if (price <= 0) {
		return qty;
	}

	/* Return the price */
	return price;
}